

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void __thiscall Js::JavascriptArray::ProcessCorePaths(JavascriptArray *this)

{
  Type *pTVar1;
  ScriptContext *pSVar2;
  RuntimeContextInfo *this_00;
  char16 *val;
  uint arrayidx;
  int iVar3;
  char16 *propName;
  undefined1 local_50 [8];
  TTAutoString pathExt;
  Var aval;
  
  pTVar1 = (this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr;
  if (pTVar1->typeId == TypeIds_Array) {
    pSVar2 = (((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    for (arrayidx = GetNextIndex(this,0xffffffff); arrayidx != 0xffffffff;
        arrayidx = GetNextIndex(this,arrayidx)) {
      pathExt.m_optFormatBuff = (char16 *)0x0;
      iVar3 = (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x70])(this,(ulong)arrayidx,&pathExt.m_optFormatBuff,pSVar2);
      if (iVar3 != 0) {
        TTD::UtilSupport::TTAutoString::TTAutoString((TTAutoString *)local_50);
        TTD::RuntimeContextInfo::BuildArrayIndexBuffer
                  (pSVar2->TTDWellKnownInfo,arrayidx,(TTAutoString *)local_50);
        val = pathExt.m_optFormatBuff;
        this_00 = pSVar2->TTDWellKnownInfo;
        propName = TTD::UtilSupport::TTAutoString::GetStrValue((TTAutoString *)local_50);
        TTD::RuntimeContextInfo::EnqueueNewPathVarAsNeeded
                  (this_00,(RecyclableObject *)this,val,propName,(char16 *)0x0);
        TTD::UtilSupport::TTAutoString::~TTAutoString((TTAutoString *)local_50);
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("Should only be used on basic arrays.");
}

Assistant:

void JavascriptArray::ProcessCorePaths()
    {
        TTDAssert(this->GetTypeId() == Js::TypeIds_Array, "Should only be used on basic arrays.");

        ScriptContext* ctx = this->GetScriptContext();

        uint32 index = Js::JavascriptArray::InvalidIndex;
        while(true)
        {
            index = this->GetNextIndex(index);
            if(index == Js::JavascriptArray::InvalidIndex) // End of array
            {
                break;
            }

            Js::Var aval = nullptr;
            if(this->DirectGetVarItemAt(index, &aval, ctx))
            {
                TTD::UtilSupport::TTAutoString pathExt;
                ctx->TTDWellKnownInfo->BuildArrayIndexBuffer(index, pathExt);

                ctx->TTDWellKnownInfo->EnqueueNewPathVarAsNeeded(this, aval, pathExt.GetStrValue());
            }
        }
    }